

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cpp
# Opt level: O0

void fixFileName(CBString *name,bool replaceSpaces)

{
  byte bVar1;
  uchar uVar2;
  bool bVar3;
  CBCharWriteProtected CVar4;
  CBCharWriteProtected local_e0;
  tagbstring *local_d0;
  uint local_c8;
  CBCharWriteProtected local_c0;
  ulong local_b0;
  size_t j;
  uint local_a0;
  CBCharWriteProtected local_98;
  tagbstring *local_88;
  uint local_80;
  CBCharWriteProtected local_78;
  tagbstring *local_68;
  uint local_60;
  CBCharWriteProtected local_58;
  tagbstring *local_48;
  uint local_40;
  CBCharWriteProtected local_38;
  int local_24;
  int local_20;
  int i;
  int nameLength;
  char table [9];
  bool replaceSpaces_local;
  CBString *name_local;
  
  stack0xffffffffffffffe6 = 0x3f7c5c223a3e3c2f;
  table[0] = '*';
  table[1] = replaceSpaces;
  unique0x100001c9 = name;
  local_20 = Bstrlib::CBString::length(name);
  local_24 = 0;
  do {
    if (local_20 <= local_24) {
      if (local_20 == 0) {
        Bstrlib::CBString::operator=(stack0xfffffffffffffff0,"_");
      }
      return;
    }
    CVar4 = Bstrlib::CBString::operator[](stack0xfffffffffffffff0,local_24);
    local_48 = CVar4.s;
    local_40 = CVar4.idx;
    local_38.s = local_48;
    local_38.idx = local_40;
    bVar1 = Bstrlib::CBCharWriteProtected::operator_cast_to_unsigned_char(&local_38);
    bVar3 = true;
    if (0x1f < bVar1) {
      CVar4 = Bstrlib::CBString::operator[](stack0xfffffffffffffff0,local_24);
      local_68 = CVar4.s;
      local_60 = CVar4.idx;
      local_58.s = local_68;
      local_58.idx = local_60;
      bVar1 = Bstrlib::CBCharWriteProtected::operator_cast_to_unsigned_char(&local_58);
      bVar3 = true;
      if ((bVar1 < 0x80) && (bVar3 = false, (table[1] & 1U) != 0)) {
        CVar4 = Bstrlib::CBString::operator[](stack0xfffffffffffffff0,local_24);
        local_88 = CVar4.s;
        local_80 = CVar4.idx;
        local_78.s = local_88;
        local_78.idx = local_80;
        uVar2 = Bstrlib::CBCharWriteProtected::operator_cast_to_unsigned_char(&local_78);
        bVar3 = uVar2 == ' ';
      }
    }
    if (bVar3) {
      CVar4 = Bstrlib::CBString::operator[](stack0xfffffffffffffff0,local_24);
      j = (size_t)CVar4.s;
      local_a0 = CVar4.idx;
      local_98.s = (tagbstring *)j;
      local_98.idx = local_a0;
      Bstrlib::CBCharWriteProtected::operator=(&local_98,'_');
    }
    else {
      for (local_b0 = 0; local_b0 < 9; local_b0 = local_b0 + 1) {
        CVar4 = Bstrlib::CBString::operator[](stack0xfffffffffffffff0,local_24);
        local_d0 = CVar4.s;
        local_c8 = CVar4.idx;
        local_c0.s = local_d0;
        local_c0.idx = local_c8;
        bVar1 = Bstrlib::CBCharWriteProtected::operator_cast_to_unsigned_char(&local_c0);
        if ((uint)bVar1 == (int)*(char *)((long)&i + local_b0 + 2)) {
          CVar4 = Bstrlib::CBString::operator[](stack0xfffffffffffffff0,local_24);
          local_e0.s = CVar4.s;
          local_e0.idx = CVar4.idx;
          Bstrlib::CBCharWriteProtected::operator=(&local_e0,'_');
          break;
        }
      }
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

void fixFileName(UString &name, bool replaceSpaces)
{
    // Replace some symbols with underscores for compatibility
    const char table[] = {
        '/', // Banned in *nix and Windows
        '<', '>', ':', '\"', '\\', '|', '?', '*', // Banned in Windows
    };
    int nameLength = (int)name.length(); // Note: Qt uses int for whatever reason.
    for (int i = 0; i < nameLength; i++) {
        if (
            name[i] < (char)0x20 || // ASCII control characters, banned in Windows, hard to work with in *nix
            name[i] > (char)0x7f || // high ASCII characters
            (replaceSpaces && name[i] == ' ') // Provides better readability
            ) {
                name[i] = '_';
                continue;
            }
        for (size_t j = 0; j < sizeof(table); j++) {
            if (name[i] == table[j]) {
                name[i] = '_';
                break;
            }
        }
    }
    if (!nameLength) {
        name = "_";
    }
}